

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

bool __thiscall t_rs_generator::is_double(t_rs_generator *this,t_type *ttype)

{
  bool bVar1;
  int iVar2;
  t_type *ptVar3;
  
  ptVar3 = t_type::get_true_type(ttype);
  iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
  if (((char)iVar2 == '\0') || (bVar1 = true, *(int *)&ptVar3[1].super_t_doc._vptr_t_doc != 7)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool t_rs_generator::is_double(t_type* ttype) {
  ttype = get_true_type(ttype);
  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    if (tbase == t_base_type::TYPE_DOUBLE) {
      return true;
    }
  }

  return false;
}